

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse41_128_16.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_rowcol_scan_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ushort *puVar1;
  ulong uVar2;
  short *psVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  int iVar12;
  parasail_result_t *ppVar13;
  __m128i *ptr;
  int16_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  __m128i *palVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  int16_t iVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  undefined2 uVar34;
  undefined4 uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  __m128i alVar47;
  undefined1 auVar48 [16];
  short sVar49;
  ushort uVar50;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  short sVar79;
  undefined1 auVar72 [16];
  undefined1 auVar80 [16];
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  __m128i_16_t e;
  __m128i_16_t h;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  short sVar35;
  short sVar41;
  short sVar43;
  short sVar46;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_rowcol_scan_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sg_flags_rowcol_scan_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_rowcol_scan_profile_sse41_128_16_cold_6();
      }
      else {
        uVar18 = profile->s1Len;
        if ((int)uVar18 < 1) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_rowcol_scan_profile_sse41_128_16_cold_1();
        }
        else {
          iVar11 = uVar18 - 1;
          uVar32 = (ulong)uVar18 + 7;
          uVar22 = uVar32 >> 3;
          uVar21 = (uint)uVar22;
          iVar12 = iVar11 / (int)uVar21;
          iVar25 = -open;
          iVar28 = ppVar5->min;
          iVar16 = -iVar28;
          if (iVar28 != iVar25 && SBORROW4(iVar28,iVar25) == iVar28 + open < 0) {
            iVar16 = open;
          }
          iVar10 = ppVar5->max;
          ppVar13 = parasail_result_new_rowcol1((uint)uVar32 & 0x7ffffff8,s2Len);
          if (ppVar13 != (parasail_result_t *)0x0) {
            ppVar13->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar13->flag | 0x8240402;
            ptr = parasail_memalign___m128i(0x10,uVar22);
            ptr_00 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m128i(0x10,uVar22);
            ptr_02 = parasail_memalign___m128i(0x10,uVar22);
            ptr_03 = parasail_memalign___m128i(0x10,uVar22);
            if (ptr_03 != (__m128i *)0x0 &&
                ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                (ptr_00 != (int16_t *)0x0 && ptr != (__m128i *)0x0))) {
              iVar14 = s2Len + -1;
              uVar19 = 7 - iVar12;
              auVar37 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar36 = auVar37._0_4_;
              auVar48._4_4_ = uVar36;
              auVar48._0_4_ = uVar36;
              auVar48._8_4_ = uVar36;
              auVar48._12_4_ = uVar36;
              auVar37 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
              uVar36 = auVar37._0_4_;
              uVar15 = iVar16 - 0x7fff;
              auVar38 = pshuflw(ZEXT416(uVar15),ZEXT416(uVar15),0);
              auVar39._0_4_ = auVar38._0_4_;
              auVar39._4_4_ = auVar39._0_4_;
              auVar39._8_4_ = auVar39._0_4_;
              auVar39._12_4_ = auVar39._0_4_;
              auVar37 = ZEXT416(CONCAT22((short)((uint)iVar28 >> 0x10),0x7ffe - (short)iVar10));
              auVar42 = pshuflw(auVar37,auVar37,0);
              auVar37._0_4_ = auVar42._0_4_;
              auVar37._4_4_ = auVar37._0_4_;
              auVar37._8_4_ = auVar37._0_4_;
              auVar37._12_4_ = auVar37._0_4_;
              auVar44 = pshuflw(ZEXT416(uVar19),ZEXT416(uVar19),0);
              sVar49 = auVar44._0_2_;
              sVar35 = auVar44._2_2_;
              auVar44 = pshufb(ZEXT416(-(uVar21 * gap)),_DAT_008d2ad0);
              auVar44 = paddsw(auVar44,ZEXT416(uVar15 & 0xffff));
              lVar29 = (long)iVar25;
              uVar33 = 0;
              do {
                lVar30 = 0;
                lVar23 = lVar29;
                do {
                  lVar31 = lVar23;
                  if (s1_beg != 0) {
                    lVar31 = 0;
                  }
                  uVar34 = 0x8000;
                  if (-0x8000 < lVar31) {
                    uVar34 = (undefined2)lVar31;
                  }
                  *(undefined2 *)((long)&local_48 + lVar30 * 2) = uVar34;
                  lVar31 = lVar31 - (ulong)(uint)open;
                  if (lVar31 < -0x7fff) {
                    lVar31 = -0x8000;
                  }
                  *(short *)((long)&local_58 + lVar30 * 2) = (short)lVar31;
                  lVar30 = lVar30 + 1;
                  lVar23 = lVar23 - uVar22 * (uint)gap;
                } while (lVar30 != 8);
                ptr_02[uVar33][0] = local_48;
                ptr_02[uVar33][1] = lStack_40;
                ptr[uVar33][0] = local_58;
                ptr[uVar33][1] = lStack_50;
                uVar33 = uVar33 + 1;
                lVar29 = lVar29 - (ulong)(uint)gap;
              } while (uVar33 != uVar22);
              *ptr_00 = 0;
              uVar33 = 1;
              do {
                iVar24 = -0x8000;
                if (-0x8000 < iVar25) {
                  iVar24 = (int16_t)iVar25;
                }
                if (s2_beg != 0) {
                  iVar24 = 0;
                }
                ptr_00[uVar33] = iVar24;
                uVar33 = uVar33 + 1;
                iVar25 = iVar25 - gap;
              } while (s2Len + 1 != uVar33);
              alVar47 = (__m128i)psubsw((undefined1  [16])0x0,auVar48);
              palVar20 = ptr_03 + (uVar21 - 1);
              uVar33 = uVar22;
              do {
                *palVar20 = alVar47;
                auVar55._4_4_ = uVar36;
                auVar55._0_4_ = uVar36;
                auVar55._8_4_ = uVar36;
                auVar55._12_4_ = uVar36;
                alVar47 = (__m128i)psubsw((undefined1  [16])alVar47,auVar55);
                sVar41 = (short)alVar47[0];
                sVar43 = auVar37._0_2_;
                auVar45._0_2_ =
                     (ushort)(sVar41 < sVar43) * sVar41 | (ushort)(sVar41 >= sVar43) * sVar43;
                sVar41 = alVar47[0]._2_2_;
                sVar43 = auVar37._2_2_;
                auVar45._2_2_ =
                     (ushort)(sVar41 < sVar43) * sVar41 | (ushort)(sVar41 >= sVar43) * sVar43;
                sVar41 = alVar47[0]._4_2_;
                sVar43 = auVar37._4_2_;
                auVar45._4_2_ =
                     (ushort)(sVar41 < sVar43) * sVar41 | (ushort)(sVar41 >= sVar43) * sVar43;
                sVar41 = alVar47[0]._6_2_;
                sVar43 = auVar37._6_2_;
                auVar45._6_2_ =
                     (ushort)(sVar41 < sVar43) * sVar41 | (ushort)(sVar41 >= sVar43) * sVar43;
                sVar41 = (short)alVar47[1];
                sVar43 = auVar37._8_2_;
                auVar45._8_2_ =
                     (ushort)(sVar41 < sVar43) * sVar41 | (ushort)(sVar41 >= sVar43) * sVar43;
                sVar41 = alVar47[1]._2_2_;
                sVar43 = auVar37._10_2_;
                auVar45._10_2_ =
                     (ushort)(sVar41 < sVar43) * sVar41 | (ushort)(sVar41 >= sVar43) * sVar43;
                sVar41 = alVar47[1]._4_2_;
                sVar43 = auVar37._12_2_;
                sVar46 = auVar37._14_2_;
                auVar45._12_2_ =
                     (ushort)(sVar41 < sVar43) * sVar41 | (ushort)(sVar41 >= sVar43) * sVar43;
                sVar41 = alVar47[1]._6_2_;
                auVar45._14_2_ =
                     (ushort)(sVar41 < sVar46) * sVar41 | (ushort)(sVar41 >= sVar46) * sVar46;
                palVar20 = palVar20 + -1;
                iVar28 = (int)uVar33;
                uVar26 = iVar28 - 1;
                uVar33 = (ulong)uVar26;
                auVar37 = auVar45;
              } while (uVar26 != 0 && 0 < iVar28);
              uVar26 = 1;
              if (1 < (int)uVar19) {
                uVar26 = uVar19;
              }
              uVar33 = 1;
              if (1 < s2Len) {
                uVar33 = (ulong)(uint)s2Len;
              }
              lVar29 = (ulong)(uVar21 + (uVar21 == 0)) << 4;
              uVar27 = 0;
              auVar71 = auVar39;
              auVar56 = auVar39;
              iVar28 = iVar14;
              do {
                uVar2 = ptr_02[uVar21 - 1][0];
                auVar52._8_8_ = ptr_02[uVar21 - 1][1] << 0x10 | uVar2 >> 0x30;
                auVar52._0_8_ = uVar2 << 0x10 | (ulong)(ushort)ptr_00[uVar27];
                iVar16 = ppVar5->mapper[(byte)s2[uVar27]];
                auVar51 = psubsw(auVar39,(undefined1  [16])*ptr_03);
                lVar23 = 0;
                auVar37 = auVar39;
                do {
                  auVar55 = *(undefined1 (*) [16])((long)*ptr_02 + lVar23);
                  auVar80 = paddsw(auVar52,*(undefined1 (*) [16])
                                            ((long)pvVar4 + lVar23 + (long)iVar16 * uVar22 * 0x10));
                  auVar52 = paddsw(auVar51,*(undefined1 (*) [16])((long)*ptr_03 + lVar23));
                  auVar7._4_4_ = uVar36;
                  auVar7._0_4_ = uVar36;
                  auVar7._8_4_ = uVar36;
                  auVar7._12_4_ = uVar36;
                  auVar51 = psubsw(*(undefined1 (*) [16])((long)*ptr + lVar23),auVar7);
                  sVar41 = auVar52._0_2_;
                  sVar43 = auVar37._0_2_;
                  auVar66._0_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar52._2_2_;
                  sVar43 = auVar37._2_2_;
                  auVar66._2_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar52._4_2_;
                  sVar43 = auVar37._4_2_;
                  auVar66._4_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar52._6_2_;
                  sVar43 = auVar37._6_2_;
                  auVar66._6_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar52._8_2_;
                  sVar43 = auVar37._8_2_;
                  auVar66._8_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar52._10_2_;
                  sVar43 = auVar37._10_2_;
                  auVar66._10_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar52._12_2_;
                  sVar43 = auVar37._12_2_;
                  sVar46 = auVar37._14_2_;
                  auVar66._12_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar52._14_2_;
                  auVar66._14_2_ =
                       (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  auVar37 = psubsw(auVar55,auVar48);
                  sVar41 = auVar51._0_2_;
                  sVar43 = auVar37._0_2_;
                  uVar81 = (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar51._2_2_;
                  sVar43 = auVar37._2_2_;
                  uVar82 = (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar51._4_2_;
                  sVar43 = auVar37._4_2_;
                  uVar83 = (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar51._6_2_;
                  sVar43 = auVar37._6_2_;
                  uVar84 = (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar51._8_2_;
                  sVar43 = auVar37._8_2_;
                  uVar85 = (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar51._10_2_;
                  sVar43 = auVar37._10_2_;
                  uVar86 = (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar51._12_2_;
                  sVar43 = auVar37._12_2_;
                  sVar46 = auVar37._14_2_;
                  uVar87 = (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar51._14_2_;
                  uVar88 = (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  sVar41 = auVar80._0_2_;
                  uVar50 = (sVar41 < (short)uVar81) * uVar81 |
                           (ushort)(sVar41 >= (short)uVar81) * sVar41;
                  sVar41 = auVar80._2_2_;
                  uVar57 = (sVar41 < (short)uVar82) * uVar82 |
                           (ushort)(sVar41 >= (short)uVar82) * sVar41;
                  sVar41 = auVar80._4_2_;
                  uVar58 = (sVar41 < (short)uVar83) * uVar83 |
                           (ushort)(sVar41 >= (short)uVar83) * sVar41;
                  sVar41 = auVar80._6_2_;
                  uVar59 = (sVar41 < (short)uVar84) * uVar84 |
                           (ushort)(sVar41 >= (short)uVar84) * sVar41;
                  auVar51._0_8_ = CONCAT26(uVar59,CONCAT24(uVar58,CONCAT22(uVar57,uVar50)));
                  sVar41 = auVar80._8_2_;
                  auVar51._8_2_ =
                       (sVar41 < (short)uVar85) * uVar85 |
                       (ushort)(sVar41 >= (short)uVar85) * sVar41;
                  sVar41 = auVar80._10_2_;
                  auVar51._10_2_ =
                       (sVar41 < (short)uVar86) * uVar86 |
                       (ushort)(sVar41 >= (short)uVar86) * sVar41;
                  sVar41 = auVar80._12_2_;
                  sVar43 = auVar80._14_2_;
                  auVar51._12_2_ =
                       (sVar41 < (short)uVar87) * uVar87 |
                       (ushort)(sVar41 >= (short)uVar87) * sVar41;
                  auVar51._14_2_ =
                       (sVar43 < (short)uVar88) * uVar88 |
                       (ushort)(sVar43 >= (short)uVar88) * sVar43;
                  puVar1 = (ushort *)((long)*ptr + lVar23);
                  *puVar1 = uVar81;
                  puVar1[1] = uVar82;
                  puVar1[2] = uVar83;
                  puVar1[3] = uVar84;
                  puVar1[4] = uVar85;
                  puVar1[5] = uVar86;
                  puVar1[6] = uVar87;
                  puVar1[7] = uVar88;
                  *(undefined1 (*) [16])((long)*ptr_01 + lVar23) = auVar51;
                  lVar23 = lVar23 + 0x10;
                  auVar37 = auVar66;
                  auVar52 = auVar55;
                } while (lVar29 != lVar23);
                auVar53._8_8_ = auVar51._8_8_ << 0x10 | (ulong)uVar59;
                uVar2 = uVar27 + 1;
                uVar81 = ptr_00[uVar27 + 1];
                auVar53._0_8_ = auVar51._0_8_ << 0x10 | (ulong)uVar81;
                auVar37 = paddsw((undefined1  [16])*ptr_03,auVar53);
                sVar41 = auVar37._0_2_;
                auVar80._0_2_ =
                     (ushort)((short)auVar66._0_2_ < sVar41) * sVar41 |
                     ((short)auVar66._0_2_ >= sVar41) * auVar66._0_2_;
                sVar41 = auVar37._2_2_;
                auVar80._2_2_ =
                     (ushort)((short)auVar66._2_2_ < sVar41) * sVar41 |
                     ((short)auVar66._2_2_ >= sVar41) * auVar66._2_2_;
                sVar41 = auVar37._4_2_;
                auVar80._4_2_ =
                     (ushort)((short)auVar66._4_2_ < sVar41) * sVar41 |
                     ((short)auVar66._4_2_ >= sVar41) * auVar66._4_2_;
                sVar41 = auVar37._6_2_;
                auVar80._6_2_ =
                     (ushort)((short)auVar66._6_2_ < sVar41) * sVar41 |
                     ((short)auVar66._6_2_ >= sVar41) * auVar66._6_2_;
                sVar41 = auVar37._8_2_;
                auVar80._8_2_ =
                     (ushort)((short)auVar66._8_2_ < sVar41) * sVar41 |
                     ((short)auVar66._8_2_ >= sVar41) * auVar66._8_2_;
                sVar41 = auVar37._10_2_;
                auVar80._10_2_ =
                     (ushort)((short)auVar66._10_2_ < sVar41) * sVar41 |
                     ((short)auVar66._10_2_ >= sVar41) * auVar66._10_2_;
                sVar41 = auVar37._12_2_;
                auVar80._12_2_ =
                     (ushort)((short)auVar66._12_2_ < sVar41) * sVar41 |
                     ((short)auVar66._12_2_ >= sVar41) * auVar66._12_2_;
                sVar41 = auVar37._14_2_;
                auVar80._14_2_ =
                     (ushort)((short)auVar66._14_2_ < sVar41) * sVar41 |
                     ((short)auVar66._14_2_ >= sVar41) * auVar66._14_2_;
                iVar16 = 6;
                do {
                  auVar67._0_8_ = auVar80._0_8_ << 0x10;
                  auVar67._8_8_ = auVar80._8_8_ << 0x10 | auVar80._0_8_ >> 0x30;
                  auVar37 = paddsw(auVar67,auVar44);
                  sVar41 = auVar80._0_2_;
                  sVar61 = auVar37._0_2_;
                  sVar43 = auVar80._2_2_;
                  sVar62 = auVar37._2_2_;
                  sVar46 = auVar80._4_2_;
                  sVar63 = auVar37._4_2_;
                  sVar60 = auVar80._6_2_;
                  sVar64 = auVar37._6_2_;
                  uVar82 = (ushort)(sVar64 < sVar60) * sVar60 | (ushort)(sVar64 >= sVar60) * sVar64;
                  auVar68._0_8_ =
                       CONCAT26(uVar82,CONCAT24((ushort)(sVar63 < sVar46) * sVar46 |
                                                (ushort)(sVar63 >= sVar46) * sVar63,
                                                CONCAT22((ushort)(sVar62 < sVar43) * sVar43 |
                                                         (ushort)(sVar62 >= sVar43) * sVar62,
                                                         (ushort)(sVar61 < sVar41) * sVar41 |
                                                         (ushort)(sVar61 >= sVar41) * sVar61)));
                  sVar41 = auVar80._8_2_;
                  sVar43 = auVar37._8_2_;
                  auVar68._8_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar80._10_2_;
                  sVar43 = auVar37._10_2_;
                  auVar68._10_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar80._12_2_;
                  sVar43 = auVar37._12_2_;
                  sVar46 = auVar37._14_2_;
                  auVar68._12_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar80._14_2_;
                  auVar68._14_2_ =
                       (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  iVar16 = iVar16 + -1;
                  auVar80 = auVar68;
                } while (iVar16 != 0);
                auVar69._0_8_ = auVar68._0_8_ << 0x10;
                auVar69._8_8_ = auVar68._8_8_ << 0x10 | (ulong)uVar82;
                auVar70 = paddsw(auVar69,ZEXT416(uVar15 & 0xffff));
                sVar41 = auVar70._0_2_;
                auVar54._0_2_ =
                     (ushort)((short)uVar81 < sVar41) * sVar41 | ((short)uVar81 >= sVar41) * uVar81;
                sVar41 = auVar70._2_2_;
                auVar54._2_2_ =
                     (ushort)((short)uVar50 < sVar41) * sVar41 | ((short)uVar50 >= sVar41) * uVar50;
                sVar41 = auVar70._4_2_;
                auVar54._4_2_ =
                     (ushort)((short)uVar57 < sVar41) * sVar41 | ((short)uVar57 >= sVar41) * uVar57;
                sVar41 = auVar70._6_2_;
                auVar54._6_2_ =
                     (ushort)((short)uVar58 < sVar41) * sVar41 | ((short)uVar58 >= sVar41) * uVar58;
                sVar41 = auVar70._8_2_;
                auVar54._8_2_ =
                     (ushort)((short)uVar59 < sVar41) * sVar41 | ((short)uVar59 >= sVar41) * uVar59;
                sVar41 = auVar70._10_2_;
                auVar54._10_2_ =
                     (ushort)((short)auVar51._8_2_ < sVar41) * sVar41 |
                     ((short)auVar51._8_2_ >= sVar41) * auVar51._8_2_;
                sVar41 = auVar70._12_2_;
                auVar54._12_2_ =
                     (ushort)((short)auVar51._10_2_ < sVar41) * sVar41 |
                     ((short)auVar51._10_2_ >= sVar41) * auVar51._10_2_;
                sVar41 = auVar70._14_2_;
                auVar54._14_2_ =
                     (ushort)((short)auVar51._12_2_ < sVar41) * sVar41 |
                     ((short)auVar51._12_2_ >= sVar41) * auVar51._12_2_;
                lVar23 = 0;
                auVar37 = auVar71;
                do {
                  auVar8._4_4_ = uVar36;
                  auVar8._0_4_ = uVar36;
                  auVar8._8_4_ = uVar36;
                  auVar8._12_4_ = uVar36;
                  auVar71 = psubsw(auVar70,auVar8);
                  auVar55 = psubsw(auVar54,auVar48);
                  sVar41 = auVar55._0_2_;
                  sVar43 = auVar71._0_2_;
                  auVar70._0_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar55._2_2_;
                  sVar43 = auVar71._2_2_;
                  auVar70._2_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar55._4_2_;
                  sVar43 = auVar71._4_2_;
                  auVar70._4_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar55._6_2_;
                  sVar43 = auVar71._6_2_;
                  auVar70._6_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar55._8_2_;
                  sVar43 = auVar71._8_2_;
                  auVar70._8_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar55._10_2_;
                  sVar43 = auVar71._10_2_;
                  auVar70._10_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar55._12_2_;
                  sVar43 = auVar71._12_2_;
                  sVar46 = auVar71._14_2_;
                  auVar70._12_2_ =
                       (ushort)(sVar43 < sVar41) * sVar41 | (ushort)(sVar43 >= sVar41) * sVar43;
                  sVar41 = auVar55._14_2_;
                  auVar70._14_2_ =
                       (ushort)(sVar46 < sVar41) * sVar41 | (ushort)(sVar46 >= sVar41) * sVar46;
                  psVar3 = (short *)((long)*ptr_01 + lVar23);
                  sVar41 = *psVar3;
                  sVar43 = psVar3[1];
                  sVar46 = psVar3[2];
                  sVar60 = psVar3[3];
                  sVar61 = psVar3[4];
                  sVar62 = psVar3[5];
                  sVar63 = psVar3[6];
                  sVar64 = psVar3[7];
                  auVar54._0_2_ =
                       (sVar41 < (short)auVar70._0_2_) * auVar70._0_2_ |
                       (ushort)(sVar41 >= (short)auVar70._0_2_) * sVar41;
                  auVar54._2_2_ =
                       (sVar43 < (short)auVar70._2_2_) * auVar70._2_2_ |
                       (ushort)(sVar43 >= (short)auVar70._2_2_) * sVar43;
                  auVar54._4_2_ =
                       (sVar46 < (short)auVar70._4_2_) * auVar70._4_2_ |
                       (ushort)(sVar46 >= (short)auVar70._4_2_) * sVar46;
                  auVar54._6_2_ =
                       (sVar60 < (short)auVar70._6_2_) * auVar70._6_2_ |
                       (ushort)(sVar60 >= (short)auVar70._6_2_) * sVar60;
                  auVar54._8_2_ =
                       (sVar61 < (short)auVar70._8_2_) * auVar70._8_2_ |
                       (ushort)(sVar61 >= (short)auVar70._8_2_) * sVar61;
                  auVar54._10_2_ =
                       (sVar62 < (short)auVar70._10_2_) * auVar70._10_2_ |
                       (ushort)(sVar62 >= (short)auVar70._10_2_) * sVar62;
                  auVar54._12_2_ =
                       (sVar63 < (short)auVar70._12_2_) * auVar70._12_2_ |
                       (ushort)(sVar63 >= (short)auVar70._12_2_) * sVar63;
                  auVar54._14_2_ =
                       (sVar64 < (short)auVar70._14_2_) * auVar70._14_2_ |
                       (ushort)(sVar64 >= (short)auVar70._14_2_) * sVar64;
                  *(undefined1 (*) [16])((long)*ptr_02 + lVar23) = auVar54;
                  sVar41 = auVar45._0_2_;
                  uVar50 = ((short)auVar70._0_2_ < sVar41) * auVar70._0_2_ |
                           (ushort)((short)auVar70._0_2_ >= sVar41) * sVar41;
                  sVar41 = auVar45._2_2_;
                  uVar57 = ((short)auVar70._2_2_ < sVar41) * auVar70._2_2_ |
                           (ushort)((short)auVar70._2_2_ >= sVar41) * sVar41;
                  sVar41 = auVar45._4_2_;
                  uVar58 = ((short)auVar70._4_2_ < sVar41) * auVar70._4_2_ |
                           (ushort)((short)auVar70._4_2_ >= sVar41) * sVar41;
                  sVar41 = auVar45._6_2_;
                  uVar59 = ((short)auVar70._6_2_ < sVar41) * auVar70._6_2_ |
                           (ushort)((short)auVar70._6_2_ >= sVar41) * sVar41;
                  sVar41 = auVar45._8_2_;
                  uVar81 = ((short)auVar70._8_2_ < sVar41) * auVar70._8_2_ |
                           (ushort)((short)auVar70._8_2_ >= sVar41) * sVar41;
                  sVar41 = auVar45._10_2_;
                  uVar82 = ((short)auVar70._10_2_ < sVar41) * auVar70._10_2_ |
                           (ushort)((short)auVar70._10_2_ >= sVar41) * sVar41;
                  sVar41 = auVar45._12_2_;
                  sVar43 = auVar45._14_2_;
                  uVar83 = ((short)auVar70._12_2_ < sVar41) * auVar70._12_2_ |
                           (ushort)((short)auVar70._12_2_ >= sVar41) * sVar41;
                  uVar84 = ((short)auVar70._14_2_ < sVar43) * auVar70._14_2_ |
                           (ushort)((short)auVar70._14_2_ >= sVar43) * sVar43;
                  auVar45._0_2_ =
                       ((short)auVar54._0_2_ < (short)uVar50) * auVar54._0_2_ |
                       ((short)auVar54._0_2_ >= (short)uVar50) * uVar50;
                  auVar45._2_2_ =
                       ((short)auVar54._2_2_ < (short)uVar57) * auVar54._2_2_ |
                       ((short)auVar54._2_2_ >= (short)uVar57) * uVar57;
                  auVar45._4_2_ =
                       ((short)auVar54._4_2_ < (short)uVar58) * auVar54._4_2_ |
                       ((short)auVar54._4_2_ >= (short)uVar58) * uVar58;
                  auVar45._6_2_ =
                       ((short)auVar54._6_2_ < (short)uVar59) * auVar54._6_2_ |
                       ((short)auVar54._6_2_ >= (short)uVar59) * uVar59;
                  auVar45._8_2_ =
                       ((short)auVar54._8_2_ < (short)uVar81) * auVar54._8_2_ |
                       ((short)auVar54._8_2_ >= (short)uVar81) * uVar81;
                  auVar45._10_2_ =
                       ((short)auVar54._10_2_ < (short)uVar82) * auVar54._10_2_ |
                       ((short)auVar54._10_2_ >= (short)uVar82) * uVar82;
                  auVar45._12_2_ =
                       ((short)auVar54._12_2_ < (short)uVar83) * auVar54._12_2_ |
                       ((short)auVar54._12_2_ >= (short)uVar83) * uVar83;
                  auVar45._14_2_ =
                       ((short)auVar54._14_2_ < (short)uVar84) * auVar54._14_2_ |
                       ((short)auVar54._14_2_ >= (short)uVar84) * uVar84;
                  sVar41 = auVar37._0_2_;
                  auVar71._0_2_ =
                       (sVar41 < (short)auVar54._0_2_) * auVar54._0_2_ |
                       (ushort)(sVar41 >= (short)auVar54._0_2_) * sVar41;
                  sVar41 = auVar37._2_2_;
                  auVar71._2_2_ =
                       (sVar41 < (short)auVar54._2_2_) * auVar54._2_2_ |
                       (ushort)(sVar41 >= (short)auVar54._2_2_) * sVar41;
                  sVar41 = auVar37._4_2_;
                  auVar71._4_2_ =
                       (sVar41 < (short)auVar54._4_2_) * auVar54._4_2_ |
                       (ushort)(sVar41 >= (short)auVar54._4_2_) * sVar41;
                  sVar41 = auVar37._6_2_;
                  auVar71._6_2_ =
                       (sVar41 < (short)auVar54._6_2_) * auVar54._6_2_ |
                       (ushort)(sVar41 >= (short)auVar54._6_2_) * sVar41;
                  sVar41 = auVar37._8_2_;
                  auVar71._8_2_ =
                       (sVar41 < (short)auVar54._8_2_) * auVar54._8_2_ |
                       (ushort)(sVar41 >= (short)auVar54._8_2_) * sVar41;
                  sVar41 = auVar37._10_2_;
                  auVar71._10_2_ =
                       (sVar41 < (short)auVar54._10_2_) * auVar54._10_2_ |
                       (ushort)(sVar41 >= (short)auVar54._10_2_) * sVar41;
                  sVar41 = auVar37._12_2_;
                  sVar43 = auVar37._14_2_;
                  auVar71._12_2_ =
                       (sVar41 < (short)auVar54._12_2_) * auVar54._12_2_ |
                       (ushort)(sVar41 >= (short)auVar54._12_2_) * sVar41;
                  auVar71._14_2_ =
                       (sVar43 < (short)auVar54._14_2_) * auVar54._14_2_ |
                       (ushort)(sVar43 >= (short)auVar54._14_2_) * sVar43;
                  lVar23 = lVar23 + 0x10;
                  auVar37 = auVar71;
                } while (lVar29 != lVar23);
                alVar47 = ptr_02[(uint)(iVar11 % (int)uVar21)];
                sVar41 = auVar56._0_2_;
                sVar65 = (short)alVar47[0];
                auVar72._0_2_ = -(ushort)(sVar41 < sVar65);
                sVar43 = auVar56._2_2_;
                sVar73 = alVar47[0]._2_2_;
                auVar72._2_2_ = -(ushort)(sVar43 < sVar73);
                sVar46 = auVar56._4_2_;
                sVar74 = alVar47[0]._4_2_;
                auVar72._4_2_ = -(ushort)(sVar46 < sVar74);
                sVar60 = auVar56._6_2_;
                sVar75 = alVar47[0]._6_2_;
                auVar72._6_2_ = -(ushort)(sVar60 < sVar75);
                sVar61 = auVar56._8_2_;
                sVar76 = (short)alVar47[1];
                auVar72._8_2_ = -(ushort)(sVar61 < sVar76);
                sVar62 = auVar56._10_2_;
                sVar77 = alVar47[1]._2_2_;
                auVar72._10_2_ = -(ushort)(sVar62 < sVar77);
                sVar63 = auVar56._12_2_;
                sVar78 = alVar47[1]._4_2_;
                sVar79 = alVar47[1]._6_2_;
                auVar72._12_2_ = -(ushort)(sVar63 < sVar78);
                sVar64 = auVar56._14_2_;
                auVar72._14_2_ = -(ushort)(sVar64 < sVar79);
                auVar9._2_2_ = -(ushort)(sVar35 == 6);
                auVar9._0_2_ = -(ushort)(sVar49 == 7);
                auVar9._4_2_ = -(ushort)(sVar49 == 5);
                auVar9._6_2_ = -(ushort)(sVar35 == 4);
                auVar9._8_2_ = -(ushort)(sVar49 == 3);
                auVar9._10_2_ = -(ushort)(sVar35 == 2);
                auVar9._12_2_ = -(ushort)(sVar49 == 1);
                auVar9._14_2_ = -(ushort)(sVar35 == 0);
                auVar72 = auVar72 & auVar9;
                if ((((((((((((((((auVar72 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar72 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar72 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar72 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar72 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar72 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar72 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar72 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar72 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar72 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar72 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar72 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar72 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar72 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar72 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar72[0xf] < '\0') {
                  iVar28 = (int)uVar27;
                }
                uVar17 = uVar26;
                if (iVar12 < 7) {
                  do {
                    lVar23 = alVar47[1];
                    alVar47[1] = alVar47[0];
                    alVar47[0] = alVar47[1] << 0x10;
                    alVar47[1] = lVar23 << 0x10 | alVar47[1] >> 0x30;
                    uVar17 = uVar17 - 1;
                  } while (uVar17 != 0);
                }
                auVar56._0_2_ =
                     (ushort)(sVar65 < sVar41) * sVar41 | (ushort)(sVar65 >= sVar41) * sVar65;
                auVar56._2_2_ =
                     (ushort)(sVar73 < sVar43) * sVar43 | (ushort)(sVar73 >= sVar43) * sVar73;
                auVar56._4_2_ =
                     (ushort)(sVar74 < sVar46) * sVar46 | (ushort)(sVar74 >= sVar46) * sVar74;
                auVar56._6_2_ =
                     (ushort)(sVar75 < sVar60) * sVar60 | (ushort)(sVar75 >= sVar60) * sVar75;
                auVar56._8_2_ =
                     (ushort)(sVar76 < sVar61) * sVar61 | (ushort)(sVar76 >= sVar61) * sVar76;
                auVar56._10_2_ =
                     (ushort)(sVar77 < sVar62) * sVar62 | (ushort)(sVar77 >= sVar62) * sVar77;
                auVar56._12_2_ =
                     (ushort)(sVar78 < sVar63) * sVar63 | (ushort)(sVar78 >= sVar63) * sVar78;
                auVar56._14_2_ =
                     (ushort)(sVar79 < sVar64) * sVar64 | (ushort)(sVar79 >= sVar64) * sVar79;
                ((ppVar13->field_4).rowcols)->score_row[uVar27] = (int)(short)(alVar47[1] >> 0x30);
                uVar27 = uVar2;
              } while (uVar2 != uVar33);
              uVar33 = 0;
              do {
                psVar3 = (short *)((long)*ptr_02 + uVar33 * 4);
                sVar49 = psVar3[1];
                sVar35 = psVar3[2];
                sVar41 = psVar3[3];
                sVar43 = psVar3[4];
                sVar46 = psVar3[5];
                sVar60 = psVar3[6];
                sVar61 = psVar3[7];
                piVar6 = ((ppVar13->field_4).rowcols)->score_col;
                *(int *)((long)piVar6 + uVar33) = (int)*psVar3;
                *(int *)((long)piVar6 + uVar21 * 4 + uVar33) = (int)sVar49;
                *(int *)((long)piVar6 + uVar22 * 8 + uVar33) = (int)sVar35;
                *(int *)((long)piVar6 + (ulong)(uVar21 * 4) * 3 + uVar33) = (int)sVar41;
                *(int *)((long)piVar6 + uVar22 * 0x10 + uVar33) = (int)sVar43;
                *(int *)((long)piVar6 + (ulong)(uVar21 * 4) * 5 + uVar33) = (int)sVar46;
                *(int *)((long)piVar6 + uVar22 * 0x18 + uVar33) = (int)sVar60;
                *(int *)((long)piVar6 + uVar22 * 0x1c + uVar33) = (int)sVar61;
                uVar33 = uVar33 + 4;
              } while ((uVar21 + (uVar21 == 0)) * 4 != uVar33);
              if (s2_end != 0) {
                if (iVar12 < 7) {
                  auVar37 = auVar56;
                  uVar15 = 1;
                  if (1 < (int)uVar19) {
                    uVar15 = uVar19;
                  }
                  do {
                    auVar44._0_8_ = auVar37._0_8_ << 0x10;
                    auVar44._8_8_ = auVar37._8_8_ << 0x10 | auVar37._0_8_ >> 0x30;
                    auVar56._14_2_ = auVar37._12_2_;
                    uVar15 = uVar15 - 1;
                    auVar37 = auVar44;
                  } while (uVar15 != 0);
                }
                uVar15 = (uint)auVar56._14_2_;
              }
              sVar49 = (short)uVar15;
              iVar16 = iVar11;
              if ((s1_end != 0) && ((uVar32 & 0x7ffffff8) != 0)) {
                uVar32 = 0;
                do {
                  iVar25 = ((uint)uVar32 & 7) * uVar21 + ((uint)(uVar32 >> 3) & 0x1fffffff);
                  if (iVar25 < (int)uVar18) {
                    auVar56._14_2_ = *(ushort *)((long)*ptr_02 + uVar32 * 2);
                    if ((short)(ushort)uVar15 < (short)auVar56._14_2_) {
                      uVar15 = (uint)auVar56._14_2_;
                      iVar28 = iVar14;
                      iVar16 = iVar25;
                    }
                    else {
                      if (iVar16 <= iVar25) {
                        iVar25 = iVar16;
                      }
                      if (iVar28 != iVar14) {
                        iVar25 = iVar16;
                      }
                      if (auVar56._14_2_ == (ushort)uVar15) {
                        iVar16 = iVar25;
                      }
                    }
                  }
                  sVar49 = (short)uVar15;
                  uVar32 = uVar32 + 1;
                } while ((uVar21 & 0xfffffff) << 3 != (int)uVar32);
              }
              if (s2_end == 0 && s1_end == 0) {
                uVar32 = ptr_02[(uint)(iVar11 % (int)uVar21)][0];
                uVar22 = ptr_02[(uint)(iVar11 % (int)uVar21)][1];
                if (iVar12 < 7) {
                  uVar18 = 1;
                  if (1 < (int)uVar19) {
                    uVar18 = uVar19;
                  }
                  do {
                    uVar22 = uVar22 << 0x10 | uVar32 >> 0x30;
                    uVar18 = uVar18 - 1;
                    uVar32 = uVar32 << 0x10;
                  } while (uVar18 != 0);
                }
                sVar49 = (short)(uVar22 >> 0x30);
                iVar28 = iVar14;
                iVar16 = iVar11;
              }
              sVar35 = auVar38._0_2_;
              auVar40._0_2_ = -(ushort)((short)auVar45._0_2_ < sVar35);
              sVar41 = auVar38._2_2_;
              auVar40._2_2_ = -(ushort)((short)auVar45._2_2_ < sVar41);
              auVar40._4_2_ = -(ushort)((short)auVar45._4_2_ < sVar35);
              auVar40._6_2_ = -(ushort)((short)auVar45._6_2_ < sVar41);
              auVar40._8_2_ = -(ushort)((short)auVar45._8_2_ < sVar35);
              auVar40._10_2_ = -(ushort)((short)auVar45._10_2_ < sVar41);
              auVar40._12_2_ = -(ushort)((short)auVar45._12_2_ < sVar35);
              auVar40._14_2_ = -(ushort)((short)auVar45._14_2_ < sVar41);
              sVar35 = auVar42._0_2_;
              auVar38._0_2_ = -(ushort)(sVar35 < (short)auVar71._0_2_);
              sVar41 = auVar42._2_2_;
              auVar38._2_2_ = -(ushort)(sVar41 < (short)auVar71._2_2_);
              auVar38._4_2_ = -(ushort)(sVar35 < (short)auVar71._4_2_);
              auVar38._6_2_ = -(ushort)(sVar41 < (short)auVar71._6_2_);
              auVar38._8_2_ = -(ushort)(sVar35 < (short)auVar71._8_2_);
              auVar38._10_2_ = -(ushort)(sVar41 < (short)auVar71._10_2_);
              auVar38._12_2_ = -(ushort)(sVar35 < (short)auVar71._12_2_);
              auVar38._14_2_ = -(ushort)(sVar41 < (short)auVar71._14_2_);
              auVar38 = auVar38 | auVar40;
              if ((((((((((((((((auVar38 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar38 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar38 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar38 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar38 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar38 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar38 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar38 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar38 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar38 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar38 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar38 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar38[0xf] < '\0') {
                *(byte *)&ppVar13->flag = (byte)ppVar13->flag | 0x40;
                sVar49 = 0;
                iVar28 = 0;
                iVar16 = 0;
              }
              ppVar13->score = (int)sVar49;
              ppVar13->end_query = iVar16;
              ppVar13->end_ref = iVar28;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar13;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi16(vH, vMaxH));
            vMaxH = _mm_max_epi16(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
        }
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            score = (int16_t) _mm_extract_epi16 (vH, 7);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}